

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_templates.h
# Opt level: O2

void __thiscall UniqueList<secplane_t>::Clear(UniqueList<secplane_t> *this)

{
  uint i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < (this->Array).Count; uVar1 = uVar1 + 1) {
    operator_delete((this->Array).Array[uVar1],0x28);
  }
  TArray<secplane_t_*,_secplane_t_*>::Clear(&this->Array);
  return;
}

Assistant:

void Clear()
	{
		for(unsigned i=0;i<Array.Size();i++) TheFreeList.Release(Array[i]);
		Array.Clear();
	}